

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O1

void __thiscall
Triangle::Triangle(Triangle *this,Vector3f *a,Vector3f *b,Vector3f *c,Vector2f *u1,Vector2f *u2,
                  Vector2f *u3,Vector3f *p,Vector3f *q,Vector3f *r,Material *m)

{
  int iVar1;
  long lVar2;
  float fVar3;
  Vector3f local_6c;
  Vector3f *local_60;
  Vector2f *local_58;
  Vector2f *local_50;
  Vector3f local_48;
  Vector3f local_3c;
  
  (this->super_Object).remit = 0;
  (this->super_Object).m = m;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_intersect_001faa60;
  this->empty = false;
  this->has_uv = false;
  lVar2 = 0x1c;
  local_58 = u1;
  local_50 = u2;
  do {
    Vector2f::Vector2f((Vector2f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x34);
  lVar2 = 0x38;
  do {
    Vector3f::Vector3f((Vector3f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x5c);
  local_60 = (Vector3f *)&this->field_0x38;
  lVar2 = 0x5c;
  do {
    Vector3f::Vector3f((Vector3f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x80);
  Vector3f::Vector3f(&this->o,0.0);
  Matrix3f::Matrix3f(&this->matrix,0.0);
  Vector3f::operator=((Vector3f *)&this->field_0x5c,a);
  Vector3f::operator=((Vector3f *)&this->field_0x68,b);
  Vector3f::operator=((Vector3f *)&this->field_0x74,c);
  Vector2f::operator=((Vector2f *)&this->field_0x1c,local_58);
  Vector2f::operator=((Vector2f *)&this->field_0x24,local_50);
  Vector2f::operator=((Vector2f *)&this->field_0x2c,u3);
  this->has_uv = true;
  operator-(a,b);
  operator-(a,c);
  Vector3f::cross(&local_3c,&local_48);
  fVar3 = Vector3f::length(&local_6c);
  fVar3 = fVar3 * 0.5;
  this->area = fVar3;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    Vector3f::normalized(&local_6c);
    Vector3f::operator=(local_60,&local_6c);
    Vector3f::normalized(&local_6c);
    Vector3f::operator=((Vector3f *)&this->field_0x44,&local_6c);
    Vector3f::normalized(&local_6c);
    Vector3f::operator=((Vector3f *)&this->field_0x50,&local_6c);
    this->use_n = true;
    iVar1 = (*m->_vptr_Material[4])(m);
    if (((char)iVar1 != '\0') && (*(char *)&m[0x28]._vptr_Material == '\0')) {
      (this->super_Object).remit = 1;
    }
    iVar1 = (*m->_vptr_Material[2])(m);
    if ((char)iVar1 != '\0') {
      prepare_coords(this);
    }
  }
  else {
    this->empty = true;
  }
  return;
}

Assistant:

Triangle(const Vector3f& a, const Vector3f& b, const Vector3f& c,
		const Vector2f& u1, const Vector2f &u2, const Vector2f& u3,
		const Vector3f& p, const Vector3f& q, const Vector3f& r, Material* m) :Object(m) {
		v[0] = a;
		v[1] = b;
		v[2] = c;
		uv[0] = u1;
		uv[1] = u2;
		uv[2] = u3;
		has_uv = true;
		area = Vector3f::cross(a - b, a - c).length() / 2;
		if (area == 0)
		{
			empty = true;
			return;
		}
		n[0] = p.normalized();
		n[1] = q.normalized();
		n[2] = r.normalized();
		use_n = true;
#ifdef TRIANGLE_REMIT
		if (m->is_brdf() && !((BRDFMaterial*)m)->emissionColor.is_empty())
			remit = 1;
#endif
		if (m->need_coords()) prepare_coords();
	}